

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O3

void SHtest(double *x,int N,int *f,int Nseas,double *season)

{
  double *pdVar1;
  double **seasonal;
  double *pdVar2;
  double *remainder;
  double *vec;
  ulong uVar3;
  ulong uVar4;
  size_t __nmemb;
  long lVar5;
  double dVar6;
  int local_4c;
  int *piStack_48;
  int Niter;
  double *local_40;
  int local_38;
  uint local_34;
  
  piStack_48 = f;
  local_40 = x;
  seasonal = (double **)calloc((long)Nseas,8);
  __nmemb = (size_t)N;
  local_38 = Nseas;
  local_34 = N;
  if (0 < Nseas) {
    uVar4 = 0;
    do {
      pdVar2 = (double *)calloc(__nmemb,8);
      seasonal[uVar4] = pdVar2;
      uVar4 = uVar4 + 1;
    } while ((uint)Nseas != uVar4);
  }
  pdVar2 = (double *)calloc(__nmemb,8);
  remainder = (double *)calloc(__nmemb,8);
  vec = (double *)calloc(__nmemb,8);
  local_4c = local_38;
  mstl(local_40,N,piStack_48,&local_4c,(int *)0x0,(double *)0x0,(int *)0x0,seasonal,pdVar2,remainder
      );
  piStack_48 = (int *)var(remainder,N);
  local_40 = (double *)(long)local_4c;
  if (0 < (long)local_40) {
    uVar4 = (ulong)local_34;
    lVar5 = 0;
    do {
      if (0 < (int)local_34) {
        pdVar1 = seasonal[lVar5];
        uVar3 = 0;
        do {
          vec[uVar3] = remainder[uVar3] + pdVar1[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      dVar6 = var(vec,local_34);
      dVar6 = 1.0 - (double)piStack_48 / dVar6;
      if (1.0 <= dVar6) {
        dVar6 = 1.0;
      }
      if (dVar6 <= 0.0) {
        dVar6 = 0.0;
      }
      season[lVar5] = dVar6;
      lVar5 = lVar5 + 1;
    } while ((double *)lVar5 != local_40);
  }
  if (0 < local_38) {
    uVar4 = 0;
    do {
      free(seasonal[uVar4]);
      uVar4 = uVar4 + 1;
    } while ((uint)Nseas != uVar4);
  }
  free(seasonal);
  free(pdVar2);
  free(remainder);
  free(vec);
  return;
}

Assistant:

void SHtest(double *x, int N, int *f, int Nseas, double *season) {
    /*
    Seasonal Heuristic Test
    */
    int i,j,Niter;
    double **seasonal, *trend, *remainder, *vari;
    double vare,tmp1;

    seasonal = (double**)calloc(Nseas,sizeof(double*));
    for(i = 0; i < Nseas;++i) {
        seasonal[i] = (double*)calloc(N,sizeof(double));
    }
    trend = (double*)calloc(N,sizeof(double));
    remainder = (double*)calloc(N,sizeof(double));
    vari = (double*)calloc(N,sizeof(double));

    /// memory leak fix, copy Nseas to Niter then pass address 
    /// of Niter to mstl as mstl has potential of modifying Niter
    /// which affects freeing of seasonal double array below
    Niter = Nseas;
    mstl(x, N,f,&Niter,NULL,NULL,NULL,seasonal,trend,remainder);

    vare = var(remainder,N);

    for(j = 0; j < Niter; ++j) {

        for(i = 0; i < N;++i) {
            vari[i] = remainder[i] + seasonal[j][i];
        }

        tmp1 = 1.0 - vare/var(vari,N);

        tmp1 = tmp1 < 1 ? tmp1 : 1;

        season[j] = tmp1 > 0 ? tmp1 : 0;

    }
    
    for(i = 0; i < Nseas;++i) {
        free(seasonal[i]);
    }

    free(seasonal);
    free(trend);
    free(remainder);
    free(vari);
}